

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeSizeof(ExpressionContext *ctx,SynSizeof *syntax)

{
  bool bVar1;
  TypeBase *node;
  TypeClass *pTVar2;
  ExprBase *initializer;
  byte local_51;
  byte local_41;
  TypeClass *typeClass_1;
  ExprBase *value;
  TypeClass *typeClass;
  TypeBase *type;
  SynSizeof *syntax_local;
  ExpressionContext *ctx_local;
  
  node = AnalyzeType(ctx,syntax->value,false,(bool *)0x0);
  if (node == (TypeBase *)0x0) {
    initializer = AnalyzeExpression(ctx,syntax->value);
    if (initializer->type == ctx->typeAuto) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,&syntax->super_SynBase,"ERROR: sizeof auto type is illegal");
    }
    pTVar2 = getType<TypeClass>(initializer->type);
    if ((pTVar2 != (TypeClass *)0x0) && ((pTVar2->completed & 1U) == 0)) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not fully defined",
                 (ulong)(uint)((int)(initializer->type->name).end -
                              (int)(initializer->type->name).begin),(initializer->type->name).begin)
      ;
    }
    ResolveInitializerValue(ctx,&syntax->super_SynBase,initializer);
    bVar1 = isType<TypeArgumentSet>(initializer->type);
    local_51 = 0;
    if (!bVar1) {
      bVar1 = isType<TypeMemberSet>(initializer->type);
      local_51 = 0;
      if (!bVar1) {
        bVar1 = isType<TypeFunctionSet>(initializer->type);
        local_51 = bVar1 ^ 0xff;
      }
    }
    if ((local_51 & 1) == 0) {
      __assert_fail("!isType<TypeArgumentSet>(value->type) && !isType<TypeMemberSet>(value->type) && !isType<TypeFunctionSet>(value->type)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x2e35,"ExprBase *AnalyzeSizeof(ExpressionContext &, SynSizeof *)");
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprIntegerLiteral>(ctx);
    ExprIntegerLiteral::ExprIntegerLiteral
              ((ExprIntegerLiteral *)ctx_local,&syntax->super_SynBase,ctx->typeInt,
               initializer->type->size);
  }
  else {
    if ((node->isGeneric & 1U) != 0) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,&syntax->super_SynBase,"ERROR: sizeof generic type is illegal");
    }
    if (node == ctx->typeAuto) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,&syntax->super_SynBase,"ERROR: sizeof auto type is illegal");
    }
    pTVar2 = getType<TypeClass>(node);
    if ((pTVar2 != (TypeClass *)0x0) && ((pTVar2->completed & 1U) == 0)) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not fully defined",
                 (ulong)(uint)((int)(node->name).end - (int)(node->name).begin),(node->name).begin);
    }
    bVar1 = isType<TypeArgumentSet>(node);
    local_41 = 0;
    if (!bVar1) {
      bVar1 = isType<TypeMemberSet>(node);
      local_41 = 0;
      if (!bVar1) {
        bVar1 = isType<TypeFunctionSet>(node);
        local_41 = bVar1 ^ 0xff;
      }
    }
    if ((local_41 & 1) == 0) {
      __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x2e23,"ExprBase *AnalyzeSizeof(ExpressionContext &, SynSizeof *)");
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprIntegerLiteral>(ctx);
    ExprIntegerLiteral::ExprIntegerLiteral
              ((ExprIntegerLiteral *)ctx_local,&syntax->super_SynBase,ctx->typeInt,node->size);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeSizeof(ExpressionContext &ctx, SynSizeof *syntax)
{
	if(TypeBase *type = AnalyzeType(ctx, syntax->value, false))
	{
		if(type->isGeneric)
			Stop(ctx, syntax, "ERROR: sizeof generic type is illegal");

		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: sizeof auto type is illegal");

		if(TypeClass *typeClass = getType<TypeClass>(type))
		{
			if(!typeClass->completed)
				Stop(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(type->name));
		}

		assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));

		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, type->size);
	}

	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(value->type == ctx.typeAuto)
		Stop(ctx, syntax, "ERROR: sizeof auto type is illegal");

	if(TypeClass *typeClass = getType<TypeClass>(value->type))
	{
		if(!typeClass->completed)
			Stop(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(value->type->name));
	}

	ResolveInitializerValue(ctx, syntax, value);

	assert(!isType<TypeArgumentSet>(value->type) && !isType<TypeMemberSet>(value->type) && !isType<TypeFunctionSet>(value->type));

	return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, value->type->size);
}